

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::Chapters::Parse(Chapters *this)

{
  long stop;
  IMkvReader *pReader;
  bool bVar1;
  long lVar2;
  long lVar3;
  long unaff_RBP;
  longlong pos;
  longlong size;
  longlong id;
  long local_50;
  Chapters *local_48;
  long local_40;
  long local_38;
  
  pReader = this->m_pSegment->m_pReader;
  local_50 = this->m_start;
  stop = this->m_size + local_50;
  if (0 < this->m_size) {
    local_48 = this;
    do {
      lVar3 = ParseElementHeader(pReader,&local_50,stop,&local_38,&local_40);
      lVar2 = local_40;
      bVar1 = true;
      if (-1 < lVar3) {
        if (local_40 == 0) {
          bVar1 = false;
          lVar3 = unaff_RBP;
        }
        else if ((local_38 != 0x45b9) ||
                (lVar3 = ParseEdition(local_48,local_50,local_40), -1 < lVar3)) {
          local_50 = lVar2 + local_50;
          bVar1 = stop < local_50;
          lVar3 = unaff_RBP;
          if (stop < local_50) {
            lVar3 = -2;
          }
        }
      }
      if (bVar1) {
        return lVar3;
      }
      unaff_RBP = lVar3;
    } while (local_50 < stop);
  }
  return (ulong)(local_50 == stop) * 2 + -2;
}

Assistant:

long Chapters::Parse() {
  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = m_start;  // payload start
  const long long stop = pos + m_size;  // payload stop

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvEditionEntry) {
      status = ParseEdition(pos, size);

      if (status < 0)  // error
        return status;
    }

    pos += size;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}